

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

bool __thiscall
Clasp::Cli::ClaspCliConfig::setAppDefaults
          (ClaspCliConfig *this,ConfigKey config,uint8 mode,ParsedOpts *seen,ProblemType t)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  string *psVar4;
  const_iterator cVar5;
  undefined4 extraout_var;
  char *exp;
  uint line;
  ClaspCliConfig *pCVar6;
  string mem;
  string local_58;
  ConfigIter local_38;
  
  paVar2 = &local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar2;
  if (t != Asp) {
    psVar4 = getOptionName(this,3,&local_58);
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)seen,psVar4);
    if ((_Rb_tree_header *)cVar5._M_node == &(seen->parsed_)._M_t._M_impl.super__Rb_tree_header) {
      iVar3 = setOption(this,3,mode,0,"2,iter=20,occ=25,time=120");
      if (iVar3 == 0) {
        exp = "setOption(opt_sat_prepro, mode, 0, \"2,iter=20,occ=25,time=120\")";
        line = 0x442;
        goto LAB_00126819;
      }
    }
  }
  if ((config == config_many && (mode & 2) == 0) && t == Asp) {
    psVar4 = getOptionName(this,0x38,&local_58);
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)seen,psVar4);
    p_Var1 = &(seen->parsed_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
      iVar3 = setOption(this,0x38,mode,0,"3");
      if (iVar3 == 0) {
        exp = "seen.count(getOptionName(opt_eq, mem)) || setOption(opt_eq, mode, 0, \"3\")";
        line = 0x445;
        goto LAB_00126819;
      }
    }
    psVar4 = getOptionName(this,0x37,&local_58);
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)seen,psVar4);
    if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
      iVar3 = setOption(this,0x37,mode,0,"dynamic");
      if (iVar3 == 0) {
        exp = 
        "seen.count(getOptionName(opt_trans_ext, mem)) || setOption(opt_trans_ext, mode, 0, \"dynamic\")"
        ;
        line = 0x446;
LAB_00126819:
        Potassco::fail(-2,
                       "bool Clasp::Cli::ClaspCliConfig::setAppDefaults(ConfigKey, uint8, const ParsedOpts &, ProblemType)"
                       ,line,exp,(char *)0x0);
      }
    }
  }
  if (config != config_nolearn) {
    pCVar6 = this;
    if ((mode & 2) != 0) {
      pCVar6 = (ClaspCliConfig *)(this->super_ClaspConfig).tester_;
    }
    iVar3 = (*(pCVar6->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
              super_Configuration._vptr_Configuration[6])(pCVar6,0);
    if ((*(byte *)(CONCAT44(extraout_var,iVar3) + 6) & 8) != 0) {
      local_38.base_ = "/[nolearn]";
      setConfig(this,&local_38,mode | 4,0,seen,(ParsedOpts *)0x0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool ClaspCliConfig::setAppDefaults(ConfigKey config, uint8 mode, const ParsedOpts& seen, ProblemType t) {
	std::string mem;
	if (t != Problem_t::Asp && !seen.count(getOptionName(opt_sat_prepro, mem))) {
		POTASSCO_REQUIRE(setOption(opt_sat_prepro, mode, 0, "2,iter=20,occ=25,time=120"));
	}
	if (!isTester(mode) && config == config_many && t == Problem_t::Asp) {
		POTASSCO_REQUIRE(seen.count(getOptionName(opt_eq, mem)) || setOption(opt_eq, mode, 0, "3"));
		POTASSCO_REQUIRE(seen.count(getOptionName(opt_trans_ext, mem)) || setOption(opt_trans_ext, mode, 0, "dynamic"));
	}
	if (config != config_nolearn && active(this, mode)->solver(0).search == SolverParams::no_learning) {
		POTASSCO_REQUIRE(setConfig(getConfig(config_nolearn), mode | mode_relaxed, 0, seen, 0));
	}
	return true;
}